

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

void __thiscall wasm::Literal::Literal(Literal *this,LaneArray<8> *lanes)

{
  undefined2 uVar1;
  long lVar2;
  int64_t *piVar3;
  int64_t *piVar4;
  size_t lane_index;
  long lVar5;
  int64_t iStack_58;
  array<unsigned_char,_16UL> bytes;
  
  (this->type).id = 6;
  piVar4 = &iStack_58;
  lVar5 = 0;
  do {
    getBits(lanes->_M_elems + lVar5,(uint8_t (*) [16])(bytes._M_elems + 8));
    uVar1 = bytes._M_elems._8_2_;
    lVar2 = 0;
    piVar3 = piVar4;
    do {
      *(char *)piVar3 = (char)((ushort)uVar1 >> ((byte)lVar2 & 0x1f));
      lVar2 = lVar2 + 8;
      piVar3 = (int64_t *)((long)piVar3 + 1);
    } while (lVar2 == 8);
    lVar5 = lVar5 + 1;
    piVar4 = (int64_t *)((long)piVar4 + 2);
  } while (lVar5 != 8);
  (this->field_0).i64 = iStack_58;
  (this->field_0).func.super_IString.str._M_str = (char *)bytes._M_elems._0_8_;
  return;
}

Assistant:

Literal::Literal(const LaneArray<8>& lanes) : type(Type::v128) {
  extractBytes<uint16_t, 8>(v128, lanes);
}